

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::AnnualTimeZoneRule::getNextStart
          (AnnualTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  UBool UVar1;
  int iVar2;
  double local_58;
  UDate tmp;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  UDate *result_local;
  uint local_28;
  uint uStack_24;
  UBool inclusive_local;
  int32_t prevDSTSavings_local;
  int32_t prevRawOffset_local;
  UDate base_local;
  AnnualTimeZoneRule *this_local;
  
  _month = result;
  result_local._7_1_ = inclusive;
  local_28 = prevDSTSavings;
  uStack_24 = prevRawOffset;
  _prevDSTSavings_local = base;
  base_local = (UDate)this;
  Grego::timeToFields(base,&dom,&dow,&doy,&mid,(int32_t *)((long)&tmp + 4),(int32_t *)&tmp);
  if (dom < this->fStartYear) {
    iVar2 = (*(this->super_TimeZoneRule).super_UObject._vptr_UObject[7])
                      (this,(ulong)uStack_24,(ulong)local_28,_month);
    this_local._7_1_ = (UBool)iVar2;
  }
  else {
    UVar1 = getStartInYear(this,dom,uStack_24,local_28,&local_58);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else if ((local_58 < _prevDSTSavings_local) ||
            (((result_local._7_1_ == '\0' && (local_58 == _prevDSTSavings_local)) &&
             (!NAN(local_58) && !NAN(_prevDSTSavings_local))))) {
      this_local._7_1_ = getStartInYear(this,dom + 1,uStack_24,local_28,_month);
    }
    else {
      *_month = local_58;
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
AnnualTimeZoneRule::getNextStart(UDate base,
                                 int32_t prevRawOffset,
                                 int32_t prevDSTSavings,
                                 UBool inclusive,
                                 UDate& result) const {
    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(base, year, month, dom, dow, doy, mid);
    if (year < fStartYear) {
        return getFirstStart(prevRawOffset, prevDSTSavings, result);
    }
    UDate tmp;
    if (getStartInYear(year, prevRawOffset, prevDSTSavings, tmp)) {
        if (tmp < base || (!inclusive && (tmp == base))) {
            // Return the next one
            return getStartInYear(year + 1, prevRawOffset, prevDSTSavings, result);
        } else {
            result = tmp;
            return TRUE;
        }
    }
    return FALSE;
}